

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::LongStressCaseInternal::DebugInfoRenderer::~DebugInfoRenderer(DebugInfoRenderer *this)

{
  ShaderProgram *this_00;
  pointer puVar1;
  pointer pfVar2;
  
  this_00 = this->m_prog;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
  }
  operator_delete(this_00,0xd0);
  puVar1 = (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_ndxBuf).
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pfVar2 = (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar2 != (pointer)0x0) {
    operator_delete(pfVar2,(long)(this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pfVar2);
    return;
  }
  return;
}

Assistant:

~DebugInfoRenderer		(void) { delete m_prog; }